

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlexer.cpp
# Opt level: O3

SQInteger __thiscall SQLexer::ReadID(SQLexer *this)

{
  uint uVar1;
  ulong uVar2;
  int iVar3;
  char *pcVar4;
  SQInteger SVar5;
  byte bVar6;
  uint uVar7;
  SQUnsignedInteger SVar8;
  char local_29;
  
  local_29 = '\0';
  sqvector<char,_unsigned_int>::resize(&this->_longstr,0,&local_29);
  bVar6 = this->_currdata;
  do {
    uVar1 = (this->_longstr)._allocated;
    uVar7 = (this->_longstr)._size;
    pcVar4 = (this->_longstr)._vals;
    if (uVar1 <= uVar7) {
      SVar8 = (SQUnsignedInteger)(uVar7 * 2);
      if (uVar7 * 2 == 0) {
        SVar8 = 4;
      }
      pcVar4 = (char *)sq_vm_realloc((this->_longstr)._alloc_ctx,pcVar4,(ulong)uVar1,SVar8);
      (this->_longstr)._vals = pcVar4;
      (this->_longstr)._allocated = (size_type)SVar8;
      uVar7 = (this->_longstr)._size;
    }
    (this->_longstr)._size = uVar7 + 1;
    pcVar4[uVar7] = bVar6;
    uVar2 = this->_sourceTextPtr;
    if (uVar2 < this->_sourceTextSize) {
      this->_sourceTextPtr = uVar2 + 1;
      bVar6 = this->_sourceText[uVar2];
    }
    else {
      this->_reached_eof = 1;
      bVar6 = 0;
    }
    this->_currdata = bVar6;
    this->_currentcolumn = this->_currentcolumn + 1;
    iVar3 = isalnum((uint)bVar6);
  } while ((bVar6 == 0x5f) || (iVar3 != 0));
  uVar1 = (this->_longstr)._allocated;
  uVar7 = (this->_longstr)._size;
  pcVar4 = (this->_longstr)._vals;
  if (uVar1 <= uVar7) {
    SVar8 = 4;
    if (uVar7 * 2 != 0) {
      SVar8 = (SQUnsignedInteger)(uVar7 * 2);
    }
    pcVar4 = (char *)sq_vm_realloc((this->_longstr)._alloc_ctx,pcVar4,(ulong)uVar1,SVar8);
    (this->_longstr)._vals = pcVar4;
    (this->_longstr)._allocated = (size_type)SVar8;
    uVar7 = (this->_longstr)._size;
  }
  (this->_longstr)._size = uVar7 + 1;
  pcVar4[uVar7] = '\0';
  SVar5 = GetIDType(this,(this->_longstr)._vals,(ulong)((this->_longstr)._size - 1));
  if ((SVar5 == 0x136) || (SVar5 == 0x102)) {
    this->_svalue = (this->_longstr)._vals;
  }
  return SVar5;
}

Assistant:

SQInteger SQLexer::ReadID()
{
    SQInteger res;
    INIT_TEMP_STRING();
    do {
        APPEND_CHAR(CUR_CHAR);
        NEXT();
    } while(isalnum(CUR_CHAR) || CUR_CHAR == _SC('_'));
    TERMINATE_BUFFER();
    res = GetIDType(&_longstr[0],_longstr.size() - 1);
    if(res == TK_IDENTIFIER || res == TK_CONSTRUCTOR) {
        SetStringValue();
    }
    return res;
}